

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall el::base::LogFormat::~LogFormat(LogFormat *this)

{
  LogFormat *this_local;
  
  ~LogFormat(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

virtual ~LogFormat(void) {}